

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

bool __thiscall google::protobuf::io::CodedOutputStream::HadError(CodedOutputStream *this)

{
  long lVar1;
  undefined1 uVar2;
  uint8_t *puVar3;
  uint8_t *ptr;
  long *plVar4;
  
  plVar4 = (long *)&stack0xffffffffffffffe8;
  ptr = this->cur_;
  puVar3 = EpsCopyOutputStream::FlushAndResetBuffer(&this->impl_,ptr);
  this->cur_ = puVar3;
  if (puVar3 != (uint8_t *)0x0) {
    return (this->impl_).had_error_;
  }
  HadError((CodedOutputStream *)&stack0xffffffffffffffe8);
  puVar3 = (uint8_t *)plVar4[1];
  if (puVar3 <= ptr && (long)ptr - (long)puVar3 != 0) {
    uVar2 = std::__cxx11::string::_M_replace_aux
                      ((ulong)plVar4,(ulong)puVar3,0,(char)((long)ptr - (long)puVar3));
    return (bool)uVar2;
  }
  plVar4[1] = (long)ptr;
  lVar1 = *plVar4;
  ptr[lVar1] = '\0';
  return SUB81(lVar1,0);
}

Assistant:

bool HadError() {
    cur_ = impl_.FlushAndResetBuffer(cur_);
    ABSL_DCHECK(cur_);
    return impl_.HadError();
  }